

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoAssembler.cpp
# Opt level: O0

AssemblerReturnValues __thiscall
NanoAssembler::assembleToFile(NanoAssembler *this,string *inputFile,string *outputFile)

{
  __node_base_ptr *this_00;
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  reference pAVar4;
  undefined1 local_300 [8];
  AssemberInstruction inst;
  iterator __end3;
  iterator __begin3;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *__range3;
  ofstream file;
  string local_98;
  undefined1 local_78 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelMap;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> lines;
  string *outputFile_local;
  string *inputFile_local;
  NanoAssembler *this_local;
  
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::vector
            ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
             &labelMap._M_h._M_single_bucket);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)local_78);
  std::__cxx11::string::string((string *)&local_98,inputFile);
  bVar1 = readLines(this,&local_98,
                    (vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                    &labelMap._M_h._M_single_bucket,
                    (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = assemble(this,(vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                          &labelMap._M_h._M_single_bucket,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)local_78);
    if (bVar1) {
      _Var3 = std::operator|(_S_out,_S_bin);
      std::ofstream::ofstream(&__range3,(string *)outputFile,_Var3);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        this_local._4_4_ = IOError;
      }
      else {
        this_00 = &labelMap._M_h._M_single_bucket;
        __end3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::begin
                           ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
                            this_00);
        inst._56_8_ = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::end
                                ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>
                                  *)this_00);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                            (&__end3,(__normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                                      *)&inst.assembled);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          pAVar4 = __gnu_cxx::
                   __normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
                   ::operator*(&__end3);
          AssemberInstruction::AssemberInstruction((AssemberInstruction *)local_300,pAVar4);
          std::ostream::write((char *)&__range3,(long)((long)&inst.line.field_2 + 8));
          AssemberInstruction::~AssemberInstruction((AssemberInstruction *)local_300);
          __gnu_cxx::
          __normal_iterator<AssemberInstruction_*,_std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>_>
          ::operator++(&__end3);
        }
        std::ofstream::close();
        this_local._4_4_ = Success;
      }
      std::ofstream::~ofstream(&__range3);
    }
    else {
      this_local._4_4_ = AssemblerError;
    }
  }
  else {
    this_local._4_4_ = IOError;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)local_78);
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::~vector
            ((vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *)
             &labelMap._M_h._M_single_bucket);
  return this_local._4_4_;
}

Assistant:

AssemblerReturnValues NanoAssembler::assembleToFile(std::string inputFile, std::string outputFile) {
	std::vector<AssemberInstruction> lines;
	std::unordered_map<std::string, size_t> labelMap;
	// Load file from disk
	if (!readLines(inputFile, lines, labelMap)) {
		return AssemblerReturnValues::IOError;
	}
	// Compile the file to bytecode
	if (assemble(lines, labelMap)) {
		// Write to disk
		std::ofstream file(outputFile, std::ios::out | std::ios::binary);
		if (file.is_open()) {
			for (AssemberInstruction inst : lines)
				file.write((const char*)& inst.bytecode[0], inst.length);
			file.close();
			return AssemblerReturnValues::Success;
		}
		return AssemblerReturnValues::IOError;
	}
	return AssemblerReturnValues::AssemblerError;
}